

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# materials.cpp
# Opt level: O0

string * __thiscall pbrt::HairMaterial::ToString_abi_cxx11_(HairMaterial *this)

{
  FloatTextureHandle *unaff_RBX;
  string *in_RDI;
  FloatTextureHandle *unaff_retaddr;
  SpectrumTextureHandle *in_stack_00000008;
  SpectrumTextureHandle *in_stack_00000010;
  char *in_stack_00000018;
  FloatTextureHandle *in_stack_00000040;
  FloatTextureHandle *in_stack_00000048;
  FloatTextureHandle *in_stack_00000050;
  FloatTextureHandle *in_stack_00000058;
  
  StringPrintf<pbrt::SpectrumTextureHandle_const&,pbrt::SpectrumTextureHandle_const&,pbrt::FloatTextureHandle_const&,pbrt::FloatTextureHandle_const&,pbrt::FloatTextureHandle_const&,pbrt::FloatTextureHandle_const&,pbrt::FloatTextureHandle_const&,pbrt::FloatTextureHandle_const&>
            (in_stack_00000018,in_stack_00000010,in_stack_00000008,unaff_retaddr,unaff_RBX,
             in_stack_00000040,in_stack_00000048,in_stack_00000050,in_stack_00000058);
  return in_RDI;
}

Assistant:

std::string HairMaterial::ToString() const {
    return StringPrintf("[ HairMaterial sigma_a: %s color: %s eumelanin: %s "
                        "pheomelanin: %s eta: %s beta_m: %s beta_n: %s alpha: %s ]",
                        sigma_a, color, eumelanin, pheomelanin, eta, beta_m, beta_n,
                        alpha);
}